

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_get_max_out_record_payload(mbedtls_ssl_context *ssl)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  
  sVar3 = mbedtls_ssl_get_output_max_frag_len(ssl);
  uVar5 = 0x400;
  if (sVar3 < 0x400) {
    uVar5 = sVar3;
  }
  sVar3 = mbedtls_ssl_get_current_mtu(ssl);
  if (sVar3 != 0) {
    iVar2 = mbedtls_ssl_get_record_expansion(ssl);
    if (iVar2 < 0) {
      bVar1 = false;
    }
    else {
      uVar4 = sVar3 - (long)iVar2;
      if (sVar3 < (ulong)(long)iVar2 || uVar4 == 0) {
        bVar1 = false;
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0xd56,"MTU too low for record expansion");
        iVar2 = -0x7080;
      }
      else {
        if (uVar4 <= uVar5) {
          uVar5 = uVar4;
        }
        bVar1 = true;
      }
    }
    if (!bVar1) {
      return iVar2;
    }
  }
  return (int)uVar5;
}

Assistant:

int mbedtls_ssl_get_max_out_record_payload(const mbedtls_ssl_context *ssl)
{
    size_t max_len = MBEDTLS_SSL_OUT_CONTENT_LEN;

#if !defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH) && \
    !defined(MBEDTLS_SSL_PROTO_DTLS)
    (void) ssl;
#endif

#if defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH)
    const size_t mfl = mbedtls_ssl_get_output_max_frag_len(ssl);

    if (max_len > mfl) {
        max_len = mfl;
    }
#endif

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (mbedtls_ssl_get_current_mtu(ssl) != 0) {
        const size_t mtu = mbedtls_ssl_get_current_mtu(ssl);
        const int ret = mbedtls_ssl_get_record_expansion(ssl);
        const size_t overhead = (size_t) ret;

        if (ret < 0) {
            return ret;
        }

        if (mtu <= overhead) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("MTU too low for record expansion"));
            return MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
        }

        if (max_len > mtu - overhead) {
            max_len = mtu - overhead;
        }
    }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

#if !defined(MBEDTLS_SSL_MAX_FRAGMENT_LENGTH) &&        \
    !defined(MBEDTLS_SSL_PROTO_DTLS)
    ((void) ssl);
#endif

    return (int) max_len;
}